

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> * __thiscall
Catch::createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
          (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           *__return_storage_ptr__,Catch *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *container,
          size_t shardCount,size_t shardIndex)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  allocator_type local_9;
  
  if (container == (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)0x1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,
               (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)this);
  }
  else {
    lVar1 = *(long *)this;
    uVar2 = *(long *)(this + 8) - lVar1 >> 4;
    uVar3 = uVar2 / (ulong)container;
    uVar2 = uVar2 % (ulong)container;
    sVar5 = shardCount;
    if (uVar2 < shardCount) {
      sVar5 = uVar2;
    }
    uVar4 = shardCount + 1;
    if (uVar4 <= uVar2) {
      uVar2 = uVar4;
    }
    std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
    vector<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,void>
              ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)
               __return_storage_ptr__,
               (TestCaseHandle *)(uVar3 * shardCount * 0x10 + sVar5 * 0x10 + lVar1),
               (TestCaseHandle *)(uVar2 * 0x10 + lVar1 + uVar3 * uVar4 * 0x10),&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }